

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool BeginPopupEx(char *str_id,ImGuiWindowFlags extra_flags)

{
  ImGuiWindowFlags *pIVar1;
  ImGuiWindow *this;
  ImGuiContext *pIVar2;
  bool bVar3;
  uint id;
  char *fmt;
  char name [32];
  
  pIVar2 = GImGui;
  this = GImGui->CurrentWindow;
  id = ImGuiWindow::GetID(this,str_id,(char *)0x0);
  bVar3 = IsPopupOpen(id);
  if (bVar3) {
    ImGui::PushStyleVar(2,0.0);
    if (((uint)extra_flags >> 0x1b & 1) == 0) {
      fmt = "##popup_%08x";
    }
    else {
      id = (pIVar2->CurrentPopupStack).Size;
      fmt = "##menu_%d";
    }
    ImFormatString(name,0x14,fmt,(ulong)id);
    bVar3 = ImGui::Begin(name,(bool *)0x0,extra_flags | 0x2000147);
    if ((this->Flags & 0x80) == 0) {
      pIVar1 = &pIVar2->CurrentWindow->Flags;
      *pIVar1 = *pIVar1 & 0xffffff7f;
    }
    if (!bVar3) {
      ImGui::EndPopup();
    }
  }
  else {
    pIVar2 = GImGui;
    pIVar2->SetNextWindowSizeConstraint = false;
    pIVar2->SetNextWindowFocus = false;
    pIVar2->SetNextWindowPosCond = 0;
    pIVar2->SetNextWindowSizeCond = 0;
    pIVar2->SetNextWindowContentSizeCond = 0;
    pIVar2->SetNextWindowCollapsedCond = 0;
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool BeginPopupEx(const char* str_id, ImGuiWindowFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = window->GetID(str_id);
    if (!IsPopupOpen(id))
    {
        ClearSetNextWindowData(); // We behave like Begin() and need to consume those values
        return false;
    }

    ImGui::PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    ImGuiWindowFlags flags = extra_flags|ImGuiWindowFlags_Popup|ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoMove|ImGuiWindowFlags_NoResize|ImGuiWindowFlags_NoSavedSettings|ImGuiWindowFlags_AlwaysAutoResize;

    char name[32];
    if (flags & ImGuiWindowFlags_ChildMenu)
        ImFormatString(name, 20, "##menu_%d", g.CurrentPopupStack.Size);    // Recycle windows based on depth
    else
        ImFormatString(name, 20, "##popup_%08x", id); // Not recycling, so we can close/open during the same frame

    bool is_open = ImGui::Begin(name, NULL, flags);
    if (!(window->Flags & ImGuiWindowFlags_ShowBorders))
        g.CurrentWindow->Flags &= ~ImGuiWindowFlags_ShowBorders;
    if (!is_open) // NB: is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
        ImGui::EndPopup();

    return is_open;
}